

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getStringLength(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  Exception *this_00;
  
  bVar1 = **(byte **)this;
  if ((byte)(bVar1 - 0x40) < 0x7f) {
    return (ulong)(bVar1 - 0x40);
  }
  if (bVar1 == 0xbf) {
    return *(ValueLength *)(*(byte **)this + 1);
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InvalidValueType,"Expecting type String");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }